

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::TransferTest::createInstance(TransferTest *this,Context *context)

{
  VkAllocationCallbacks **__s;
  undefined4 uVar1;
  VkBuffer VVar2;
  VkCommandBuffer_s *pVVar3;
  VkImage VVar4;
  VkAllocationCallbacks **ppVVar5;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar6;
  TimestampTestInstance *this_00;
  DeviceInterface *vkd;
  VkDevice device;
  Move<vk::Handle<(vk::HandleType)8>_> local_d8;
  VkAllocationCallbacks *local_b8;
  DeviceInterface *pDStack_b0;
  VkDevice local_a8;
  VkAllocationCallbacks *pVStack_a0;
  VkDevice *local_90;
  Move<vk::Handle<(vk::HandleType)6>_> *local_88;
  VkDevice *local_80;
  Move<vk::VkCommandBuffer_s_*> *local_78;
  VkDevice *local_70;
  Move<vk::VkCommandBuffer_s_*> *local_68;
  StageFlagVector *local_60;
  VkAllocationCallbacks **local_58;
  Move<vk::Handle<(vk::HandleType)24>_> *local_50;
  vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_48;
  
  this_00 = (TimestampTestInstance *)operator_new(0x200);
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&local_48,&(this->super_TimestampTest).m_stages);
  uVar1 = *(undefined4 *)&(this->super_TimestampTest).field_0x8c;
  TimestampTestInstance::TimestampTestInstance
            (this_00,context,&local_48,(this->super_TimestampTest).m_inRenderPass);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TransferTestInstance_00d55b38;
  *(undefined4 *)&this_00[1].super_TestInstance._vptr_TestInstance = uVar1;
  this_00[1].super_TestInstance.m_context = (Context *)0x100;
  local_60 = &this_00[1].m_stages;
  local_50 = &this_00[1].m_cmdPool;
  local_68 = &this_00[1].m_cmdBuffer;
  local_70 = &this_00[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  this_00[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this_00[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this_00[1].m_inRenderPass = 0;
  this_00[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  this_00[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this_00[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this_00[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this_00[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
       0x400000025;
  *(undefined4 *)
   &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       4;
  this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x100;
  __s = &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator
  ;
  local_58 = &this_00[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
              m_allocator;
  local_78 = &this_00[2].m_cmdBuffer;
  local_80 = &this_00[2].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  this_00[2].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_88 = &this_00[2].m_fence;
  this_00[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  local_90 = &this_00[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
              m_device;
  this_00[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  memset(__s,0,0x88);
  vkd = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  TimestampTestInstance::createBufferAndBindMemory
            (&local_d8,this_00,(VkDeviceSize)this_00[1].super_TestInstance.m_context,0x21,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar2.m_internal =
       (deUint64)
       (local_60->
       super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
               &this_00[1].m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish,VVar2);
  }
  (local_60->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  *(VkAllocationCallbacks **)(local_60 + 1) = pVStack_a0;
  (local_60->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  (local_60->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pDStack_b0;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  memset(*(void **)(this_00[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                   0x18),0xff,(size_t)this_00[1].super_TestInstance.m_context);
  pVVar3 = this_00[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(pVVar3 + 8),*(VkDeviceSize *)(pVVar3 + 0x10),
             (VkDeviceSize)this_00[1].super_TestInstance.m_context);
  pMVar6 = local_50;
  TimestampTestInstance::createBufferAndBindMemory
            (&local_d8,this_00,(VkDeviceSize)this_00[1].super_TestInstance.m_context,0x22,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_70);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar2.m_internal =
       (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
               &this_00[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               VVar2);
  }
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_device = local_a8;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_allocator = pVStack_a0;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       (deUint64)local_b8;
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_deviceIface = pDStack_b0
  ;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  ppVVar5 = local_58;
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_00,
             (VkFormat)
             this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,3,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*__s != (VkAllocationCallbacks *)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&this_00[1].m_queryPool,(VkImage)*__s);
  }
  this_00[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_a8;
  this_00[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)pVStack_a0;
  *__s = local_b8;
  this_00[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
       (deUint64)pDStack_b0;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal);
  }
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_00,
             (VkFormat)
             this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,0x12,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*ppVVar5 != (VkAllocationCallbacks *)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&this_00[1].m_timestampValues,
               (VkImage)*ppVVar5);
  }
  ppVVar5[2] = (VkAllocationCallbacks *)local_a8;
  ppVVar5[3] = pVStack_a0;
  *ppVVar5 = local_b8;
  ppVVar5[1] = (VkAllocationCallbacks *)pDStack_b0;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal);
  }
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_00,VK_FORMAT_D16_UNORM,
             *(deUint32 *)
              ((long)&this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,2,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_88);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar4.m_internal =
       (deUint64)
       this_00[2].m_stages.
       super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &this_00[2].m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish,VVar4);
  }
  this_00[2].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  *(VkAllocationCallbacks **)&this_00[2].m_inRenderPass = pVStack_a0;
  this_00[2].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  this_00[2].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pDStack_b0;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal);
  }
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_00,
             (VkFormat)
             this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_00[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,0x13,VK_SAMPLE_COUNT_4_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  local_a8 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_a0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_b0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar4.m_internal =
       this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               VVar4);
  }
  this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_a8;
  this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       pVStack_a0;
  this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_b8;
  this_00[2].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       pDStack_b0;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal);
  }
  if (local_48.
      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* TransferTest::createInstance(Context& context) const
{
  return new TransferTestInstance(context, m_stages, m_inRenderPass, m_method);
}